

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O0

Abc_Cex_t * Pdr_ManDeriveCex(Pdr_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Cex_t *p_00;
  int local_30;
  int nFrames;
  int Lit;
  int f;
  int i;
  Pdr_Obl_t *pObl;
  Abc_Cex_t *pCex;
  Pdr_Man_t *p_local;
  
  local_30 = 0;
  for (_f = p->pQueue; _f != (Pdr_Obl_t *)0x0; _f = _f->pNext) {
    local_30 = local_30 + 1;
  }
  iVar2 = Aig_ManRegNum(p->pAig);
  iVar3 = Saig_ManPiNum(p->pAig);
  p_00 = Abc_CexAlloc(iVar2,iVar3,local_30);
  p_00->iPo = p->iOutCur;
  p_00->iFrame = local_30 + -1;
  _f = p->pQueue;
  nFrames = 0;
  do {
    if (_f == (Pdr_Obl_t *)0x0) {
      if (nFrames != local_30) {
        __assert_fail("f == nFrames",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                      ,0x1af,"Abc_Cex_t *Pdr_ManDeriveCex(Pdr_Man_t *)");
      }
      iVar2 = Saig_ManVerifyCex(p->pAig,p_00);
      if (iVar2 == 0) {
        printf("CEX for output %d is not valid.\n",(ulong)(uint)p->iOutCur);
      }
      return p_00;
    }
    for (Lit = _f->pState->nLits; Lit < _f->pState->nTotal; Lit = Lit + 1) {
      iVar2 = *(int *)(&_f->pState->field_0x14 + (long)Lit * 4);
      iVar3 = Abc_LitIsCompl(iVar2);
      if ((iVar3 == 0) && (iVar3 = Abc_Lit2Var(iVar2), iVar3 < p_00->nPis)) {
        iVar3 = Abc_Lit2Var(iVar2);
        if (p_00->nPis <= iVar3) {
          __assert_fail("Abc_Lit2Var(Lit) < pCex->nPis",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                        ,0x1ac,"Abc_Cex_t *Pdr_ManDeriveCex(Pdr_Man_t *)");
        }
        iVar3 = p_00->nRegs;
        iVar1 = p_00->nPis;
        iVar2 = Abc_Lit2Var(iVar2);
        Abc_InfoSetBit((uint *)(p_00 + 1),iVar3 + nFrames * iVar1 + iVar2);
      }
    }
    _f = _f->pNext;
    nFrames = nFrames + 1;
  } while( true );
}

Assistant:

Abc_Cex_t * Pdr_ManDeriveCex( Pdr_Man_t * p )
{
    Abc_Cex_t * pCex;
    Pdr_Obl_t * pObl;
    int i, f, Lit, nFrames = 0;
    // count the number of frames
    for ( pObl = p->pQueue; pObl; pObl = pObl->pNext )
        nFrames++;
    // create the counter-example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), nFrames );
    pCex->iPo    = p->iOutCur;
    pCex->iFrame = nFrames-1;
    for ( pObl = p->pQueue, f = 0; pObl; pObl = pObl->pNext, f++ )
        for ( i = pObl->pState->nLits; i < pObl->pState->nTotal; i++ )
        {
            Lit = pObl->pState->Lits[i];
            if ( Abc_LitIsCompl(Lit) )
                continue;
            if ( Abc_Lit2Var(Lit) >= pCex->nPis ) // allows PPI literals to be thrown away
                continue;
            assert( Abc_Lit2Var(Lit) < pCex->nPis );
            Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + Abc_Lit2Var(Lit) );
        }
    assert( f == nFrames );
    if ( !Saig_ManVerifyCex(p->pAig, pCex) )
        printf( "CEX for output %d is not valid.\n", p->iOutCur );
    return pCex;
}